

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

assetsys_error_t assetsys_dismount(assetsys_t *sys,char *path,char *mounted_as)

{
  strpool_t *pool;
  bool bVar1;
  mz_bool mVar2;
  uint uVar3;
  assetsys_error_t aVar4;
  size_t sVar5;
  unsigned_long_long handle;
  unsigned_long_long handle_00;
  bool bVar6;
  assetsys_internal_mount_t *paVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  assetsys_error_t local_44;
  
  if (path == (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  aVar4 = ASSETSYS_ERROR_INVALID_MOUNT;
  if (mounted_as != (char *)0x0) {
    pool = &sys->strpool;
    sVar5 = strlen(path);
    handle = strpool_inject(pool,path,(int)sVar5);
    sVar5 = strlen(mounted_as);
    handle_00 = strpool_inject(pool,mounted_as,(int)sVar5);
    bVar6 = 0 < sys->mounts_count;
    if (0 < sys->mounts_count) {
      lVar8 = 0;
      do {
        bVar1 = true;
        if ((sys->mounts[lVar8].mounted_as == handle_00) &&
           (paVar7 = sys->mounts + lVar8, paVar7->path == handle)) {
          local_44 = ASSETSYS_SUCCESS;
          if (paVar7->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
            mVar2 = mz_zip_reader_end(&paVar7->zip);
            local_44 = (uint)(mVar2 != 0) * 4 + ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP;
          }
          strpool_decref(pool,paVar7->mounted_as);
          strpool_decref(pool,paVar7->path);
          strpool_discard(pool,handle_00);
          strpool_discard(pool,handle);
          if (0 < paVar7->dirs_count) {
            lVar9 = 0;
            do {
              assetsys_internal_remove_collated(sys,paVar7->dirs[lVar9].collated_index);
              lVar9 = lVar9 + 1;
            } while (lVar9 < paVar7->dirs_count);
          }
          if (0 < paVar7->files_count) {
            lVar9 = 8;
            lVar10 = 0;
            do {
              assetsys_internal_remove_collated(sys,*(int *)((long)&paVar7->files->size + lVar9));
              lVar10 = lVar10 + 1;
              lVar9 = lVar9 + 0xc;
            } while (lVar10 < paVar7->files_count);
          }
          free(paVar7->dirs);
          free(paVar7->files);
          uVar3 = sys->mounts_count - (int)lVar8;
          if (uVar3 != 0 && (int)lVar8 <= sys->mounts_count) {
            memcpy(sys->mounts + lVar8,sys->mounts + lVar8 + 1,(ulong)uVar3 * 0x98);
          }
          sys->mounts_count = sys->mounts_count + -1;
          bVar1 = false;
        }
        if (!bVar1) break;
        lVar8 = lVar8 + 1;
        bVar6 = lVar8 < sys->mounts_count;
      } while (lVar8 < sys->mounts_count);
    }
    aVar4 = local_44;
    if (!bVar6) {
      strpool_discard(pool,handle_00);
      strpool_discard(pool,handle);
      aVar4 = ASSETSYS_ERROR_INVALID_MOUNT;
    }
  }
  return aVar4;
}

Assistant:

assetsys_error_t assetsys_dismount( assetsys_t* sys, char const* path, char const* mounted_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mounted_as ) return ASSETSYS_ERROR_INVALID_MOUNT;

    ASSETSYS_U64 path_handle = strpool_inject( &sys->strpool, path, (int) strlen( path ) );
    ASSETSYS_U64 mount_handle = strpool_inject( &sys->strpool, mounted_as, (int) strlen( mounted_as ) );

    for( int i = 0; i < sys->mounts_count; ++i )
        {
        struct assetsys_internal_mount_t* mount = &sys->mounts[ i ];
        if( mount->mounted_as == mount_handle && mount->path == path_handle )
            {
            mz_bool result = 1;
            if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP ) result = mz_zip_reader_end( &mount->zip );

            strpool_decref( &sys->strpool, mount->mounted_as );
            strpool_decref( &sys->strpool, mount->path );
            strpool_discard( &sys->strpool, mount_handle );
            strpool_discard( &sys->strpool, path_handle );
            
            for( int j = 0; j < mount->dirs_count; ++j )
                assetsys_internal_remove_collated( sys, mount->dirs[ j ].collated_index );

            for( int j = 0; j < mount->files_count; ++j )
                assetsys_internal_remove_collated( sys, mount->files[ j ].collated_index );

            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );

            int count = sys->mounts_count - i;
            if( count > 0 ) memcpy( &sys->mounts[ i ], &sys->mounts[ i + 1 ], sizeof( *sys->mounts ) * count );
            --sys->mounts_count;

            return !result ? ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP : ASSETSYS_SUCCESS;
            }
        }

    strpool_discard( &sys->strpool, mount_handle );
    strpool_discard( &sys->strpool, path_handle );
    return ASSETSYS_ERROR_INVALID_MOUNT;
    }